

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.cc
# Opt level: O3

void __thiscall google::protobuf::util::converter::ProtoWriter::WriteRootMessage(ProtoWriter *this)

{
  _Elt_pointer pSVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  LogMessage *other;
  CodedOutputStream *this_00;
  byte *pbVar6;
  byte *pbVar7;
  int iVar8;
  uint uVar9;
  undefined1 local_a0 [8];
  ArrayInputStream input_stream;
  void *local_68;
  void *data;
  deque<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
  *local_58;
  int local_4c;
  int iStack_48;
  int length;
  LogFinisher local_3a;
  byte local_39 [7];
  uint8 insert_buffer [10];
  
  if (this->done_ == true) {
    protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/util/internal/proto_writer.cc"
               ,0x30d);
    other = protobuf::internal::LogMessage::operator<<
                      ((LogMessage *)local_a0,"CHECK failed: !done_: ");
    protobuf::internal::LogFinisher::operator=(&local_3a,other);
    protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_a0);
  }
  data = &this->stream_;
  _iStack_48 = 0;
  std::
  __uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
  ::reset((__uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
           *)data,(pointer)0x0);
  io::ArrayInputStream::ArrayInputStream
            ((ArrayInputStream *)local_a0,(this->buffer_)._M_dataplus._M_p,
             (int)(this->buffer_)._M_string_length,-1);
  local_58 = &this->size_insert_;
  while( true ) {
    bVar2 = io::ArrayInputStream::Next((ArrayInputStream *)local_a0,&local_68,&local_4c);
    if (!bVar2) break;
    if (local_4c != 0) {
      pSVar1 = (this->size_insert_).
               super__Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      iVar8 = local_4c;
      if (((this->size_insert_).
           super__Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur != pSVar1) &&
         (iVar3 = pSVar1->pos - iStack_48, iVar3 < local_4c)) {
        iVar8 = iVar3;
      }
      (*this->output_->_vptr_ByteSink[2])(this->output_,local_68,(long)iVar8);
      if (local_4c - iVar8 != 0 && iVar8 <= local_4c) {
        io::ArrayInputStream::BackUp((ArrayInputStream *)local_a0,local_4c - iVar8);
      }
      uVar9 = iVar8 + iStack_48;
      pSVar1 = (this->size_insert_).
               super__Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      _iStack_48 = (ulong)uVar9;
      if (((this->size_insert_).
           super__Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur != pSVar1) &&
         (_iStack_48 = (ulong)uVar9, uVar9 == pSVar1->pos)) {
        uVar4 = pSVar1->size;
        local_3a = SUB41(uVar4,0);
        if (uVar4 < 0x80) {
          pbVar7 = local_39;
        }
        else {
          local_3a = (LogFinisher)((byte)local_3a | 0x80);
          if (uVar4 < 0x4000) {
            local_39[0] = (byte)(uVar4 >> 7);
            pbVar7 = local_39 + 1;
          }
          else {
            pbVar7 = local_39 + 1;
            uVar4 = uVar4 >> 7;
            do {
              pbVar6 = pbVar7;
              pbVar6[-1] = (byte)uVar4 | 0x80;
              uVar5 = uVar4 >> 7;
              pbVar7 = pbVar6 + 1;
              bVar2 = 0x3fff < uVar4;
              uVar4 = uVar5;
            } while (bVar2);
            *pbVar6 = (byte)uVar5;
          }
        }
        (*this->output_->_vptr_ByteSink[2])(this->output_,&local_3a,(long)pbVar7 - (long)&local_3a);
        std::
        deque<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
        ::pop_front(local_58);
        _iStack_48 = (ulong)uVar9;
      }
    }
  }
  (*this->output_->_vptr_ByteSink[3])();
  this_00 = (CodedOutputStream *)operator_new(0x50);
  io::CodedOutputStream::CodedOutputStream
            (this_00,&(this->adapter_).super_ZeroCopyOutputStream,true);
  std::
  __uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
  ::reset((__uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
           *)data,this_00);
  this->done_ = true;
  return;
}

Assistant:

void ProtoWriter::WriteRootMessage() {
  GOOGLE_DCHECK(!done_);
  int curr_pos = 0;
  // Calls the destructor of CodedOutputStream to remove any uninitialized
  // memory from the Cord before we read it.
  stream_.reset(nullptr);
  const void* data;
  int length;
  io::ArrayInputStream input_stream(buffer_.data(), buffer_.size());
  while (input_stream.Next(&data, &length)) {
    if (length == 0) continue;
    int num_bytes = length;
    // Write up to where we need to insert the size field.
    // The number of bytes we may write is the smaller of:
    //   - the current fragment size
    //   - the distance to the next position where a size field needs to be
    //     inserted.
    if (!size_insert_.empty() &&
        size_insert_.front().pos - curr_pos < num_bytes) {
      num_bytes = size_insert_.front().pos - curr_pos;
    }
    output_->Append(static_cast<const char*>(data), num_bytes);
    if (num_bytes < length) {
      input_stream.BackUp(length - num_bytes);
    }
    curr_pos += num_bytes;
    // Insert the size field.
    //   size_insert_.front():      the next <index, size> pair to be written.
    //   size_insert_.front().pos:  position of the size field.
    //   size_insert_.front().size: the size (integer) to be inserted.
    if (!size_insert_.empty() && curr_pos == size_insert_.front().pos) {
      // Varint32 occupies at most 10 bytes.
      uint8 insert_buffer[10];
      uint8* insert_buffer_pos = CodedOutputStream::WriteVarint32ToArray(
          size_insert_.front().size, insert_buffer);
      output_->Append(reinterpret_cast<const char*>(insert_buffer),
                      insert_buffer_pos - insert_buffer);
      size_insert_.pop_front();
    }
  }
  output_->Flush();
  stream_.reset(new CodedOutputStream(&adapter_));
  done_ = true;
}